

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image2D.cpp
# Opt level: O3

void __thiscall Image2D::Image2D(Image2D *this,string *name,string *type,int width,int height)

{
  pointer pcVar1;
  int iVar2;
  FileType FVar3;
  
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + name->_M_string_length);
  this->m_width = width;
  this->m_height = height;
  this->m_components = 3;
  std::ofstream::ofstream((ofstream *)&this->m_ofstream);
  iVar2 = std::__cxx11::string::compare((char *)type);
  if (iVar2 == 0) {
    FVar3 = PPM;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)type);
    if (iVar2 == 0) {
      FVar3 = PNG;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)type);
      if (iVar2 == 0) {
        FVar3 = BMP;
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)type);
        if (iVar2 == 0) {
          FVar3 = TGA;
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)type);
          if (iVar2 != 0) {
            return;
          }
          FVar3 = HDR;
        }
      }
    }
  }
  this->m_type = FVar3;
  return;
}

Assistant:

Image2D::Image2D(const std::string &name, const std::string &type, int width, int height)
: m_name(name),
  m_width(width),
  m_height(height),
  m_components(3)
{
	if (type == "PPM") {
		m_type = FileType::PPM;
	}
	else if (type == "PNG") {
		m_type = FileType::PNG;
	}
	else if (type == "BMP") {
		m_type = FileType::BMP;
	}
	else if (type == "TGA") {
		m_type = FileType::TGA;
	}
	else if (type == "HDR") {
		m_type = FileType::HDR;
	}
}